

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

void __thiscall
Minisat::vec<Minisat::Solver::ShrinkStackElem,_int>::capacity
          (vec<Minisat::Solver::ShrinkStackElem,_int> *this,Size min_cap)

{
  uint uVar1;
  ShrinkStackElem *pSVar2;
  int *piVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = this->cap;
  if ((int)uVar1 < min_cap) {
    uVar6 = (min_cap - uVar1) + 1 & 0xfffffffe;
    uVar5 = ((int)uVar1 >> 1 & 0xfffffffeU) + 2;
    if ((int)uVar5 < (int)uVar6) {
      uVar5 = uVar6;
    }
    if ((int)(uVar1 ^ 0x7fffffff) < (int)uVar5) {
LAB_0010d40b:
      uVar4 = __cxa_allocate_exception(1);
      __cxa_throw(uVar4,&OutOfMemoryException::typeinfo,0);
    }
    this->cap = uVar5 + uVar1;
    pSVar2 = (ShrinkStackElem *)realloc(this->data,(long)(int)(uVar5 + uVar1) << 3);
    this->data = pSVar2;
    if (pSVar2 == (ShrinkStackElem *)0x0) {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) goto LAB_0010d40b;
    }
  }
  return;
}

Assistant:

void vec<T,_Size>::capacity(Size min_cap) {
    if (cap >= min_cap) return;
    Size add = max((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    const Size size_max = std::numeric_limits<Size>::max();
    if ( ((size_max <= std::numeric_limits<int>::max()) && (add > size_max - cap))
    ||   (((data = (T*)::realloc(data, (cap += add) * sizeof(T))) == NULL) && errno == ENOMEM) )
        throw OutOfMemoryException();
 }